

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpCommsSS.cpp
# Opt level: O1

void __thiscall helics::tcp::TcpCommsSS::setFlag(TcpCommsSS *this,string_view flag,bool val)

{
  bool bVar1;
  int iVar2;
  char *__s1;
  size_t sVar3;
  size_type __rlen;
  
  __s1 = flag._M_str;
  sVar3 = flag._M_len;
  if (sVar3 == 9) {
    iVar2 = bcmp(__s1,"encrypted",9);
    if (iVar2 == 0) {
      bVar1 = CommsInterface::propertyLock((CommsInterface *)this);
      if (!bVar1) {
        return;
      }
      (this->super_NetworkCommsInterface).encrypted = val;
      goto LAB_002c501d;
    }
  }
  else if (sVar3 == 0xe) {
    iVar2 = bcmp(__s1,"allow_outgoing",0xe);
    if (iVar2 == 0) {
      bVar1 = CommsInterface::propertyLock((CommsInterface *)this);
      if (!bVar1) {
        return;
      }
      this->outgoingConnectionsAllowed = val;
LAB_002c501d:
      CommsInterface::propertyUnLock((CommsInterface *)this);
      return;
    }
  }
  else if ((sVar3 == 0xd) && (iVar2 = bcmp(__s1,"reuse_address",0xd), iVar2 == 0)) {
    bVar1 = CommsInterface::propertyLock((CommsInterface *)this);
    if (!bVar1) {
      return;
    }
    this->reuse_address = val;
    goto LAB_002c501d;
  }
  NetworkCommsInterface::setFlag(&this->super_NetworkCommsInterface,flag,val);
  return;
}

Assistant:

void TcpCommsSS::setFlag(std::string_view flag, bool val)
{
    if (flag == "reuse_address") {
        if (propertyLock()) {
            reuse_address = val;
            propertyUnLock();
        }
    } else if (flag == "allow_outgoing") {
        if (propertyLock()) {
            outgoingConnectionsAllowed = val;
            propertyUnLock();
        }
    } else if (flag == "encrypted") {
        if (propertyLock()) {
            encrypted = val;
            propertyUnLock();
        }
    } else {
        NetworkCommsInterface::setFlag(flag, val);
    }
}